

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllMatch.h
# Opt level: O3

void __thiscall
oout::AllMatch::AllMatch<oout::Match_const,oout::ContainMatch>
          (AllMatch *this,shared_ptr<const_oout::Match> *match1,
          shared_ptr<const_oout::Match> *matches,shared_ptr<oout::ContainMatch> *matches_1)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Match>_> __l;
  undefined8 uStack_60;
  shared_ptr<const_oout::Match> local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>
  local_28;
  
  local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (match1->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (match1->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_58.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (matches->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40 = (matches->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_38 = (matches_1->super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30 = (matches_1->super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = &local_58;
  std::
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>::
  vector(&local_28,__l,(allocator_type *)((long)&uStack_60 + 7));
  AllMatch(this,&local_28);
  std::
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>::
  ~vector(&local_28);
  lVar1 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar1) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar1));
    }
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit AllMatch(
		const std::shared_ptr<const Match> &match1,
		const std::shared_ptr<T> & ... matches
	) : AllMatch(std::vector<std::shared_ptr<const Match>>{
		match1, matches...
	    })
	{
	}